

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O3

void __thiscall re2c::Node::~Node(Node *this)

{
  path_t *ppVar1;
  pointer ppvVar2;
  
  ppVar1 = this->suffix;
  if ((ppVar1 != (path_t *)0x0) &&
     (ppvVar2 = (ppVar1->arcs).
                super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start, ppvVar2 != (pointer)0x0)) {
    operator_delete(ppvVar2,(long)(ppVar1->arcs).
                                  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppvVar2
                   );
  }
  operator_delete(ppVar1,0x38);
  std::
  _Rb_tree<re2c::rule_t,_re2c::rule_t,_std::_Identity<re2c::rule_t>,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>
  ::~_Rb_tree(&(this->reachable)._M_t);
  std::
  _Rb_tree<re2c::Node_*,_std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
  ::~_Rb_tree(&(this->arcsets)._M_t);
  std::
  _Rb_tree<re2c::Node_*,_std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<re2c::Node_*,_std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               *)this);
  return;
}

Assistant:

Node::~Node ()
{
	delete suffix;
}